

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wl_monitor.c
# Opt level: O3

void outputHandleDone(void *userData,wl_output *output)

{
  undefined8 uVar1;
  long lVar2;
  undefined1 auVar3 [16];
  
  if ((*(int *)((long)userData + 0x88) < 1) || (*(int *)((long)userData + 0x8c) < 1)) {
    uVar1 = *(undefined8 *)
             (*(long *)((long)userData + 0x98) + (long)*(int *)((long)userData + 0x10c) * 0x18);
    auVar3._0_4_ = (float)(int)uVar1 * 25.4;
    auVar3._4_4_ = (float)(int)((ulong)uVar1 >> 0x20) * 25.4;
    auVar3._8_8_ = 0;
    auVar3 = divps(auVar3,_DAT_0014b070);
    *(ulong *)((long)userData + 0x88) = CONCAT44((int)auVar3._4_4_,(int)auVar3._0_4_);
  }
  if (0 < (long)_glfw.monitorCount) {
    lVar2 = 0;
    do {
      if (_glfw.monitors[lVar2] == (_GLFWmonitor *)userData) {
        return;
      }
      lVar2 = lVar2 + 1;
    } while (_glfw.monitorCount != lVar2);
  }
  _glfwInputMonitor((_GLFWmonitor *)userData,0x40001,1);
  return;
}

Assistant:

static void outputHandleDone(void* userData, struct wl_output* output)
{
    struct _GLFWmonitor* monitor = userData;

    if (monitor->widthMM <= 0 || monitor->heightMM <= 0)
    {
        // If Wayland does not provide a physical size, assume the default 96 DPI
        const GLFWvidmode* mode = &monitor->modes[monitor->wl.currentMode];
        monitor->widthMM  = (int) (mode->width * 25.4f / 96.f);
        monitor->heightMM = (int) (mode->height * 25.4f / 96.f);
    }

    for (int i = 0; i < _glfw.monitorCount; i++)
    {
        if (_glfw.monitors[i] == monitor)
            return;
    }

    _glfwInputMonitor(monitor, GLFW_CONNECTED, _GLFW_INSERT_LAST);
}